

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# summary.cpp
# Opt level: O1

OperatorResultType
duckdb::SummaryFunction
          (ExecutionContext *context,TableFunctionInput *data_p,DataChunk *input,DataChunk *output)

{
  reference this;
  reference other;
  ulong uVar1;
  size_type __n;
  idx_t index;
  string summary_val;
  undefined1 *local_d0;
  long local_c8;
  undefined1 local_c0 [16];
  string local_b0;
  string local_90;
  Value local_70;
  
  output->count = input->count;
  if (input->count != 0) {
    index = 0;
    do {
      local_d0 = local_c0;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_d0,"[","");
      if ((input->data).super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
          super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>._M_impl.
          super__Vector_impl_data._M_finish !=
          (input->data).super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
          super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>._M_impl.
          super__Vector_impl_data._M_start) {
        uVar1 = 0;
        do {
          DataChunk::GetValue(&local_70,input,uVar1,index);
          Value::ToString_abi_cxx11_(&local_90,&local_70);
          ::std::__cxx11::string::_M_append((char *)&local_d0,(ulong)local_90._M_dataplus._M_p);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_90._M_dataplus._M_p != &local_90.field_2) {
            operator_delete(local_90._M_dataplus._M_p);
          }
          Value::~Value(&local_70);
          if (uVar1 < ((long)(input->data).
                             super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
                             super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
                             _M_impl.super__Vector_impl_data._M_finish -
                       (long)(input->data).
                             super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
                             super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
                             _M_impl.super__Vector_impl_data._M_start >> 3) * 0x4ec4ec4ec4ec4ec5 -
                      1U) {
            ::std::__cxx11::string::append((char *)&local_d0);
          }
          uVar1 = uVar1 + 1;
        } while (uVar1 < (ulong)(((long)(input->data).
                                        super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>
                                        .
                                        super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>
                                        ._M_impl.super__Vector_impl_data._M_finish -
                                  (long)(input->data).
                                        super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>
                                        .
                                        super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>
                                        ._M_impl.super__Vector_impl_data._M_start >> 3) *
                                0x4ec4ec4ec4ec4ec5));
      }
      ::std::__cxx11::string::append((char *)&local_d0);
      local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
      ::std::__cxx11::string::_M_construct<char*>((string *)&local_b0,local_d0,local_d0 + local_c8);
      Value::Value(&local_70,&local_b0);
      DataChunk::SetValue(output,0,index,&local_70);
      Value::~Value(&local_70);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
        operator_delete(local_b0._M_dataplus._M_p);
      }
      if (local_d0 != local_c0) {
        operator_delete(local_d0);
      }
      index = index + 1;
    } while (index < input->count);
  }
  if ((input->data).super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
      super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>._M_impl.
      super__Vector_impl_data._M_finish !=
      (input->data).super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
      super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>._M_impl.
      super__Vector_impl_data._M_start) {
    __n = 0;
    do {
      uVar1 = __n + 1;
      this = vector<duckdb::Vector,_true>::operator[](&output->data,uVar1);
      other = vector<duckdb::Vector,_true>::operator[](&input->data,__n);
      Vector::Reference(this,other);
      __n = uVar1;
    } while (uVar1 < (ulong)(((long)(input->data).
                                    super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
                                    super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>
                                    ._M_impl.super__Vector_impl_data._M_finish -
                              (long)(input->data).
                                    super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
                                    super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>
                                    ._M_impl.super__Vector_impl_data._M_start >> 3) *
                            0x4ec4ec4ec4ec4ec5));
  }
  return NEED_MORE_INPUT;
}

Assistant:

static OperatorResultType SummaryFunction(ExecutionContext &context, TableFunctionInput &data_p, DataChunk &input,
                                          DataChunk &output) {
	output.SetCardinality(input.size());

	for (idx_t row_idx = 0; row_idx < input.size(); row_idx++) {
		string summary_val = "[";

		for (idx_t col_idx = 0; col_idx < input.ColumnCount(); col_idx++) {
			summary_val += input.GetValue(col_idx, row_idx).ToString();
			if (col_idx < input.ColumnCount() - 1) {
				summary_val += ", ";
			}
		}
		summary_val += "]";
		output.SetValue(0, row_idx, Value(summary_val));
	}
	for (idx_t col_idx = 0; col_idx < input.ColumnCount(); col_idx++) {
		output.data[col_idx + 1].Reference(input.data[col_idx]);
	}
	return OperatorResultType::NEED_MORE_INPUT;
}